

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

TypeDescriptor * modDivOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  types *ptVar1;
  NumberDescriptor *this;
  ostream *poVar2;
  double dVar3;
  double __y;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  NumberDescriptor *remainder;
  TypeDescriptor *rightValue_local;
  TypeDescriptor *leftValue_local;
  
  remainder = (NumberDescriptor *)rightValue;
  rightValue_local = leftValue;
  ptVar1 = TypeDescriptor::type(leftValue);
  if (*ptVar1 == NUMBER) {
    ptVar1 = TypeDescriptor::type(&remainder->super_TypeDescriptor);
    if (*ptVar1 == NUMBER) {
      this = (NumberDescriptor *)operator_new(0x60);
      dVar3 = TypeDescriptor::getNumber(rightValue_local);
      __y = TypeDescriptor::getNumber(&remainder->super_TypeDescriptor);
      dVar3 = fmod(dVar3,__y);
      NumberDescriptor::NumberDescriptor(this,dVar3);
      return &this->super_TypeDescriptor;
    }
  }
  ptVar1 = TypeDescriptor::type(rightValue_local);
  if (*ptVar1 != STRING) {
    ptVar1 = TypeDescriptor::type(&remainder->super_TypeDescriptor);
    if (*ptVar1 != STRING) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(2);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"TypeDescriptor *modDivOperator: ");
  TypeDescriptor::getString_abi_cxx11_(&local_50,rightValue_local);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2," % ");
  TypeDescriptor::getString_abi_cxx11_(&local_70,&remainder->super_TypeDescriptor);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cannot do modular division:");
  TypeDescriptor::getString_abi_cxx11_(&local_90,rightValue_local);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  poVar2 = std::operator<<(poVar2," % ");
  TypeDescriptor::getString_abi_cxx11_(&local_b0,&remainder->super_TypeDescriptor);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  exit(2);
}

Assistant:

TypeDescriptor *modDivOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *remainder = new  NumberDescriptor(fmod(leftValue->getNumber(), rightValue->getNumber()));
        //std::cout << "TypeDescriptor *modDivOperator: " << leftValue->getNumber() << " % " << rightValue->getNumber() << std::endl;
        return remainder;
    }else if(leftValue->type() == TypeDescriptor::STRING
    || rightValue->type() == TypeDescriptor::STRING ){

        std::cout << "TypeDescriptor *modDivOperator: " << leftValue->getString()  << " % " << rightValue->getString()  << std::endl;
        std::cout << "Cannot do modular division:" << leftValue->getString()  << " % " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}